

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O0

void __thiscall
Jupiter::HTTP::Server::hook
          (Server *this,string_view host,string_view name,
          unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          *content)

{
  Data *this_00;
  string_view in_path;
  string_view hostname;
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  local_60;
  Server *local_58;
  char *pcStack_50;
  char *local_48;
  char *pcStack_40;
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  *local_38;
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  *content_local;
  Server *this_local;
  string_view name_local;
  string_view host_local;
  
  pcStack_50 = name._M_str;
  local_58 = (Server *)name._M_len;
  pcStack_40 = host._M_str;
  local_48 = (char *)host._M_len;
  this_00 = this->m_data;
  local_38 = content;
  content_local =
       (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
        *)this;
  this_local = local_58;
  name_local._M_len = (size_t)pcStack_50;
  name_local._M_str = local_48;
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  unique_ptr(&local_60,content);
  hostname._M_str = pcStack_40;
  hostname._M_len = (size_t)local_48;
  in_path._M_str = pcStack_50;
  in_path._M_len = (size_t)local_58;
  Data::hook(this_00,hostname,in_path,&local_60);
  std::
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>::
  ~unique_ptr(&local_60);
  return;
}

Assistant:

void Jupiter::HTTP::Server::hook(std::string_view host, std::string_view name, std::unique_ptr<Content> content) {
	return m_data->hook(host, name, std::move(content));
}